

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O2

vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *
cfd::core::ScriptUtil::ExtractPubkeysFromMultisigScript
          (vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *__return_storage_ptr__,
          Script *multisig_script,uint32_t *require_num)

{
  IteratorWrapper<cfd::core::ScriptElement> *pIVar1;
  undefined4 uVar2;
  ScriptType SVar3;
  CfdException *pCVar4;
  const_iterator *pcVar5;
  long lVar6;
  const_iterator *pcVar7;
  ScriptElementType local_23c;
  CfdSourceLocation local_238;
  ScriptElement local_220;
  ScriptElement require_num_element;
  IteratorWrapper<cfd::core::ScriptElement> itr;
  int64_t contain_pubkey_num;
  ScriptElement element;
  vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> local_98;
  vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> elements;
  string local_68;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  (__return_storage_ptr__->super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::vector
            (&elements,&multisig_script->script_stack_);
  ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::vector
            (&local_98,&elements);
  ::std::__cxx11::string::string
            ((string *)&local_68,"Invalid script element access",(allocator *)&element);
  IteratorWrapper<cfd::core::ScriptElement>::IteratorWrapper(&itr,&local_98,&local_68,true);
  ::std::__cxx11::string::~string((string *)&local_68);
  ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::~vector
            (&local_98);
  pcVar7 = &itr.iterator_;
  while( true ) {
    while( true ) {
      pIVar1 = (IteratorWrapper<cfd::core::ScriptElement> *)
               &itr.vector_.
                super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                ._M_impl.super__Vector_impl_data;
      if (itr.reverse_ != false) {
        pIVar1 = &itr;
      }
      pcVar5 = pcVar7;
      if (itr.reverse_ != false) {
        pcVar5 = &itr.reverse_iterator_.current;
      }
      if (pcVar5->_M_current ==
          *(ScriptElement **)
           &((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *)
            ((long)pIVar1 + 8))->
            super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>)
      goto LAB_0035925f;
      IteratorWrapper<cfd::core::ScriptElement>::next(&element,&itr);
      SVar3 = element.op_code_.data_type_;
      uVar2 = ScriptOperator::OP_CHECKMULTISIGVERIFY._8_4_;
      if (element.type_ == kElementOpCode) break;
      ScriptElement::~ScriptElement(&element);
    }
    if (element.op_code_.data_type_ == ScriptOperator::OP_CHECKMULTISIG._8_4_) break;
    ScriptElement::~ScriptElement(&element);
    if (SVar3 == uVar2) {
LAB_0035925f:
      pIVar1 = (IteratorWrapper<cfd::core::ScriptElement> *)
               &itr.vector_.
                super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                ._M_impl.super__Vector_impl_data;
      if (itr.reverse_ != false) {
        pIVar1 = &itr;
      }
      pcVar5 = pcVar7;
      if (itr.reverse_ != false) {
        pcVar5 = &itr.reverse_iterator_.current;
      }
      if (pcVar5->_M_current ==
          *(ScriptElement **)
           &((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *)
            ((long)pIVar1 + 8))->
            super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>)
      {
        require_num_element._vptr_ScriptElement = (_func_int **)0x4af137;
        require_num_element.type_ = 0x628;
        require_num_element.op_code_._vptr_ScriptOperator = (_func_int **)anon_var_dwarf_286dde;
        Script::ToString_abi_cxx11_((string *)&element,multisig_script);
        logger::warn<std::__cxx11::string>
                  ((CfdSourceLocation *)&require_num_element,
                   "Multisig opcode (OP_CHECKMULTISIG|VERIFY) not found in redeem script: script={}"
                   ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&element);
        ::std::__cxx11::string::~string((string *)&element);
        pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::__cxx11::string::string
                  ((string *)&element,
                   "OP_CHCKMULTISIG(OP_CHECKMULTISIGVERIFY) not found in redeem script.",
                   (allocator *)&require_num_element);
        CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&element);
        __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
      }
      IteratorWrapper<cfd::core::ScriptElement>::next(&element,&itr);
      if (((element.type_ != kElementNumber) && (element.value_ == 0)) &&
         (element.op_code_.data_type_ != kOpFalse)) {
        local_220._vptr_ScriptElement = (_func_int **)0x4af137;
        local_220.type_ = 0x636;
        local_220.op_code_._vptr_ScriptOperator = (_func_int **)0x458ecd;
        Script::ToString_abi_cxx11_((string *)&require_num_element,multisig_script);
        logger::warn<std::__cxx11::string>
                  ((CfdSourceLocation *)&local_220,
                   "Invalid OP_CHECKMULTISIG(VERIFY) input in redeem script. Missing contain pubkey number.: script={}"
                   ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    &require_num_element);
        ::std::__cxx11::string::~string((string *)&require_num_element);
        pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::__cxx11::string::string
                  ((string *)&require_num_element,
                   "Invalid OP_CHCKMULTISIG(OP_CHECKMULTISIGVERIFY) input in redeem script. Missing contain pubkey number."
                   ,(allocator *)&local_220);
        CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&require_num_element);
        __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
      }
      contain_pubkey_num = element.value_;
      for (lVar6 = 0; lVar6 < element.value_; lVar6 = lVar6 + 1) {
        pIVar1 = (IteratorWrapper<cfd::core::ScriptElement> *)
                 &itr.vector_.
                  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                  ._M_impl.super__Vector_impl_data;
        if (itr.reverse_ != false) {
          pIVar1 = &itr;
        }
        pcVar5 = pcVar7;
        if (itr.reverse_ != false) {
          pcVar5 = &itr.reverse_iterator_.current;
        }
        if (pcVar5->_M_current ==
            *(ScriptElement **)
             &((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *)
              ((long)pIVar1 + 8))->
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
           ) {
          local_220._vptr_ScriptElement = (_func_int **)0x4af137;
          local_220.type_ = 0x645;
          local_220.op_code_._vptr_ScriptOperator = (_func_int **)0x458ecd;
          Script::ToString_abi_cxx11_((string *)&require_num_element,multisig_script);
          logger::warn<long&,std::__cxx11::string>
                    ((CfdSourceLocation *)&local_220,
                     "Not found enough pubkeys in redeem script.: require_pubkey_num={}, script={}",
                     &contain_pubkey_num,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &require_num_element);
          ::std::__cxx11::string::~string((string *)&require_num_element);
          pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
          ::std::__cxx11::string::string
                    ((string *)&require_num_element,"Not found enough pubkeys in redeem script.",
                     (allocator *)&local_220);
          CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&require_num_element)
          ;
          __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
        }
        IteratorWrapper<cfd::core::ScriptElement>::next(&require_num_element,&itr);
        if (require_num_element.type_ != kElementBinary) {
          local_238.filename = "cfdcore_script.cpp";
          local_238.line = 0x652;
          local_238.funcname = "ExtractPubkeysFromMultisigScript";
          local_23c = require_num_element.type_;
          ScriptElement::ToString_abi_cxx11_((string *)&local_220,&require_num_element);
          logger::warn<cfd::core::ScriptElementType,std::__cxx11::string>
                    (&local_238,
                     "Invalid script element. Not binary element.: ScriptElementType={}, data={}",
                     &local_23c,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_220
                    );
          ::std::__cxx11::string::~string((string *)&local_220);
          pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
          ::std::__cxx11::string::string
                    ((string *)&local_220,"Invalid ScriptElementType.(not binary)",
                     (allocator *)&local_238);
          CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&local_220);
          __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
        }
        ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_48,
                   &require_num_element.binary_data_.data_);
        Pubkey::Pubkey((Pubkey *)&local_220,(ByteData *)&local_48);
        ::std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::
        emplace_back<cfd::core::Pubkey>(__return_storage_ptr__,(Pubkey *)&local_220);
        ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_220);
        ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_48)
        ;
        ScriptElement::~ScriptElement(&require_num_element);
      }
      local_220._vptr_ScriptElement =
           (_func_int **)CONCAT44(local_220._vptr_ScriptElement._4_4_,0xff);
      ScriptElement::ScriptElement(&require_num_element,(ScriptType *)&local_220);
      pIVar1 = (IteratorWrapper<cfd::core::ScriptElement> *)
               &itr.vector_.
                super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                ._M_impl.super__Vector_impl_data;
      if (itr.reverse_ != false) {
        pIVar1 = &itr;
      }
      if (itr.reverse_ != false) {
        pcVar7 = &itr.reverse_iterator_.current;
      }
      if (pcVar7->_M_current !=
          *(ScriptElement **)
           &((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *)
            ((long)pIVar1 + 8))->
            super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>)
      {
        IteratorWrapper<cfd::core::ScriptElement>::next(&local_220,&itr);
        ScriptElement::operator=(&require_num_element,&local_220);
        ScriptElement::~ScriptElement(&local_220);
      }
      if (((require_num_element.type_ == kElementNumber || require_num_element.value_ != 0) &&
          (require_num_element.type_ == kElementOpCode)) && (0 < require_num_element.value_)) {
        if (require_num != (uint32_t *)0x0) {
          *require_num = (uint32_t)require_num_element.value_;
        }
        ::std::
        __reverse<__gnu_cxx::__normal_iterator<cfd::core::Pubkey*,std::vector<cfd::core::Pubkey,std::allocator<cfd::core::Pubkey>>>>
                  ((__return_storage_ptr__->
                   super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>).
                   _M_impl.super__Vector_impl_data._M_start,
                   (__return_storage_ptr__->
                   super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>).
                   _M_impl.super__Vector_impl_data._M_finish);
        ScriptElement::~ScriptElement(&require_num_element);
        ScriptElement::~ScriptElement(&element);
        IteratorWrapper<cfd::core::ScriptElement>::~IteratorWrapper(&itr);
        ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::~vector
                  (&elements);
        return __return_storage_ptr__;
      }
      local_238.filename = "cfdcore_script.cpp";
      local_238.line = 0x667;
      local_238.funcname = "ExtractPubkeysFromMultisigScript";
      Script::ToString_abi_cxx11_((string *)&local_220,multisig_script);
      logger::warn<std::__cxx11::string>
                (&local_238,
                 "Invalid OP_CHECKMULTISIG(VERIFY) input in redeem script. Missing require signature number.: script={}"
                 ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_220);
      ::std::__cxx11::string::~string((string *)&local_220);
      pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string
                ((string *)&local_220,
                 "Invalid OP_CHCKMULTISIG(OP_CHECKMULTISIGVERIFY) input in redeem script. Missing require signature number."
                 ,(allocator *)&local_238);
      CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&local_220);
      __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
    }
  }
  ScriptElement::~ScriptElement(&element);
  goto LAB_0035925f;
}

Assistant:

std::vector<Pubkey> ScriptUtil::ExtractPubkeysFromMultisigScript(
    const Script& multisig_script, uint32_t* require_num) {
  std::vector<Pubkey> pubkeys;
  const std::vector<ScriptElement> elements = multisig_script.GetElementList();

  // find OP_CHECKMULTISIG or OP_CHECKMULTISIGVERIFY
  IteratorWrapper<ScriptElement> itr = IteratorWrapper<ScriptElement>(
      elements, "Invalid script element access", true);
  // search OP_CHECKMULTISIG(or VERIFY)
  while (itr.hasNext()) {
    ScriptElement element = itr.next();
    if (!element.IsOpCode()) {
      continue;
    }
    if (element.GetOpCode() == ScriptOperator::OP_CHECKMULTISIG ||
        element.GetOpCode() == ScriptOperator::OP_CHECKMULTISIGVERIFY) {
      break;
    }
  }
  // target opcode not found
  if (!itr.hasNext()) {
    warn(
        CFD_LOG_SOURCE,
        "Multisig opcode (OP_CHECKMULTISIG|VERIFY) not found"
        " in redeem script: script={}",
        multisig_script.ToString());
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "OP_CHCKMULTISIG(OP_CHECKMULTISIGVERIFY) not found"
        " in redeem script.");
  }

  // get contain pubkey num
  const ScriptElement& op_m = itr.next();
  if (!op_m.IsNumber()) {
    warn(
        CFD_LOG_SOURCE,
        "Invalid OP_CHECKMULTISIG(VERIFY) input in redeem script."
        " Missing contain pubkey number.: script={}",
        multisig_script.ToString());
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Invalid OP_CHCKMULTISIG(OP_CHECKMULTISIGVERIFY) input"
        " in redeem script. Missing contain pubkey number.");
  }

  // set pubkey to vector(reverse data)
  int64_t contain_pubkey_num = op_m.GetNumber();
  for (int64_t i = 0; i < contain_pubkey_num; ++i) {
    if (!itr.hasNext()) {
      warn(
          CFD_LOG_SOURCE,
          "Not found enough pubkeys in redeem script.: "
          "require_pubkey_num={}, script={}",
          contain_pubkey_num, multisig_script.ToString());
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Not found enough pubkeys in redeem script.");
    }

    const ScriptElement& pubkey_element = itr.next();
    // check script element type
    if (!pubkey_element.IsBinary()) {
      warn(
          CFD_LOG_SOURCE,
          "Invalid script element. Not binary element.: "
          "ScriptElementType={}, data={}",
          pubkey_element.GetType(), pubkey_element.ToString());
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Invalid ScriptElementType.(not binary)");
    }

    // push pubkey data
    pubkeys.push_back(Pubkey(pubkey_element.GetBinaryData()));
  }

  // check opcode(require signature num)
  ScriptElement require_num_element(ScriptType::kOpInvalidOpCode);
  if (itr.hasNext()) {
    require_num_element = itr.next();
  }
  if (!(require_num_element.IsNumber() && require_num_element.IsOpCode()) ||
      (require_num_element.GetNumber() <= 0)) {
    warn(
        CFD_LOG_SOURCE,
        "Invalid OP_CHECKMULTISIG(VERIFY) input in redeem script."
        " Missing require signature number.: script={}",
        multisig_script.ToString());
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Invalid OP_CHCKMULTISIG(OP_CHECKMULTISIGVERIFY) input"
        " in redeem script. Missing require signature number.");
  }

  if (require_num) {
    *require_num = static_cast<uint32_t>(require_num_element.GetNumber());
  }
  // return reverse pubkey vector
  std::reverse(std::begin(pubkeys), std::end(pubkeys));
  return pubkeys;
}